

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline_int8_x86(Convolution_x86_avx512 *this,Option *opt)

{
  float fVar1;
  Allocator *pAVar2;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  int iVar6;
  byte *in_RSI;
  Mat *in_RDI;
  Option *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  Mat *in_stack_00000010;
  Mat *in_stack_00000018;
  float scale_in;
  int p;
  int out_elempack;
  int elempack;
  int num_input;
  int maxk;
  int in_stack_00000090;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  Mat *in_stack_000000a0;
  Mat *in_stack_000000a8;
  int in_stack_00000100;
  int in_stack_00000104;
  int in_stack_00000108;
  int in_stack_0000010c;
  Mat *in_stack_00000110;
  Mat *in_stack_00000118;
  int in_stack_00000188;
  int in_stack_0000018c;
  int in_stack_00000190;
  int in_stack_00000194;
  Mat *in_stack_00000198;
  Mat *in_stack_000001a0;
  Option *in_stack_000001a8;
  int in_stack_000001b0;
  int in_stack_000001b4;
  Mat *in_stack_000001b8;
  Mat *in_stack_000001c0;
  int in_stack_00000250;
  int in_stack_00000258;
  int in_stack_00000288;
  int in_stack_0000028c;
  int in_stack_00000290;
  int in_stack_00000294;
  Mat *in_stack_00000298;
  int in_stack_000002a0;
  int in_stack_000002a4;
  Mat *in_stack_000002a8;
  Mat *in_stack_000002b0;
  Allocator *in_stack_ffffffffffffff28;
  undefined8 *puVar7;
  int *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  int _w;
  int *piVar8;
  Mat *pMVar9;
  float local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  
  uVar5 = (long)*(int *)((long)&in_RDI[3].w + *(long *)((long)in_RDI->data + -0x18)) /
          (long)(*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) *
                *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)));
  iVar6 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
               (long)*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)));
  local_ac = 1;
  local_b0 = 1;
  if ((in_RSI[0x27] & 1) != 0) {
    local_ac = 1;
    if (iVar6 % 8 == 0) {
      local_ac = 8;
    }
    local_b0 = 1;
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) % 4 == 0) {
      local_b0 = 4;
    }
  }
  if ((local_ac == 8) && (local_b0 == 4)) {
    if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
       ((((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
          (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
         (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1)) &&
        ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1 &&
         (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1)))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                 in_stack_00000094,in_stack_00000090);
    }
    else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
            (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
             ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 2
               && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 2)
               ))))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                 in_stack_00000094,in_stack_00000090);
    }
    else if (((in_RSI[0x1c] & 1) == 0) ||
            ((((((in_RSI[0x38] & 1) == 0 ||
                (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) != 3))
               || (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) != 3)) ||
              ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) != 1 ||
               (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) != 1))))
             || ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) !=
                  1 || (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18))
                        != 1)))))) {
      if ((in_RSI[0x1d] & 1) == 0) {
        convolution_transform_kernel_packed_int8_sse
                  (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                   in_stack_00000094,in_stack_00000090,in_stack_00000250,in_stack_00000258);
      }
      else {
        convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                  (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                   in_stack_00000094,in_stack_00000090);
      }
    }
    else {
      conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse
                (in_stack_000001c0,in_stack_000001b8,in_stack_000001b4,in_stack_000001b0,
                 in_stack_000001a8);
    }
  }
  if ((local_ac == 1) && (local_b0 == 4)) {
    if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
        (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
          (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
         (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1)))) &&
       ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1 &&
        (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1)))) {
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                (in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108,
                 in_stack_00000104,in_stack_00000100);
    }
    else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
            (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
             ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 2
               && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 2)
               ))))))) {
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                (in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108,
                 in_stack_00000104,in_stack_00000100);
    }
    else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 3) &&
            ((((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 3 &&
               (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1))
              && (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1))
             && ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) ==
                  1 && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18))
                        == 1)))))) {
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                (in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108,
                 in_stack_00000104,in_stack_00000100);
    }
    else if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 3) &&
             ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 3 &&
              (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1))))
            && ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
                ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) ==
                  2 && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18))
                        == 2)))))) {
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                (in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108,
                 in_stack_00000104,in_stack_00000100);
    }
    else if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 7) &&
             (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 7 &&
               (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1))
              && (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1))
             )) && ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4)
                     == 2 && (*(int *)((long)&in_RDI[3].elemsize +
                                      *(long *)((long)in_RDI->data + -0x18)) == 2)))) {
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                (in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108,
                 in_stack_00000104,in_stack_00000100);
    }
    else if ((in_RSI[0x1d] & 1) == 0) {
      convolution_transform_kernel_packed_int8_sse
                (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                 in_stack_00000094,in_stack_00000090,in_stack_00000250,in_stack_00000258);
    }
    else {
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                (in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108,
                 in_stack_00000104,in_stack_00000100);
    }
  }
  if ((local_ac == 8) && (local_b0 == 1)) {
    if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
        (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
          (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
         (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1)))) &&
       ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1 &&
        (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1)))) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                (in_stack_000001a0,in_stack_00000198,in_stack_00000194,in_stack_00000190,
                 in_stack_0000018c,in_stack_00000188);
    }
    else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
            (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
             ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 2
               && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 2)
               ))))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                (in_stack_000001a0,in_stack_00000198,in_stack_00000194,in_stack_00000190,
                 in_stack_0000018c,in_stack_00000188);
    }
    else if (((in_RSI[0x1c] & 1) == 0) ||
            (((((((in_RSI[0x38] & 1) == 0 ||
                 (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) != 3)
                 ) || (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) != 3)
                ) || ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4)
                       != 1 || (*(int *)((long)&in_RDI[3].refcount +
                                        *(long *)((long)in_RDI->data + -0x18)) != 1)))) ||
              (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) != 1)
              ) || (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) != 1
                   )))) {
      if ((in_RSI[0x1d] & 1) == 0) {
        convolution_transform_kernel_packed_int8_sse
                  (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                   in_stack_00000094,in_stack_00000090,in_stack_00000250,in_stack_00000258);
      }
      else {
        convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                  (in_stack_000001a0,in_stack_00000198,in_stack_00000194,in_stack_00000190,
                   in_stack_0000018c,in_stack_00000188);
      }
    }
    else {
      conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse
                (in_stack_000002b0,in_stack_000002a8,in_stack_000002a4,in_stack_000002a0,
                 (Option *)in_stack_00000298);
    }
  }
  _w = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if ((local_ac == 1) && (local_b0 == 1)) {
    if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
        (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
          (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
         (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1)))) &&
       ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1 &&
        (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1)))) {
      convolution_im2col_sgemm_transform_kernel_int8_sse
                ((Mat *)CONCAT44(in_stack_000002a4,in_stack_000002a0),in_stack_00000298,
                 in_stack_00000294,in_stack_00000290,in_stack_0000028c,in_stack_00000288);
    }
    else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
            (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
             ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 2
               && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 2)
               ))))))) {
      convolution_im2col_sgemm_transform_kernel_int8_sse
                ((Mat *)CONCAT44(in_stack_000002a4,in_stack_000002a0),in_stack_00000298,
                 in_stack_00000294,in_stack_00000290,in_stack_0000028c,in_stack_00000288);
    }
    else if (((in_RSI[0x1c] & 1) == 0) ||
            ((((((in_RSI[0x37] & 1) == 0 ||
                (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) != 3))
               || (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) != 3)) ||
              (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) != 1 ||
                (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) != 1))
               || ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4)
                    != 1 || ((*(int *)((long)&in_RDI[3].elemsize +
                                      *(long *)((long)in_RDI->data + -0x18)) != 1 || (iVar6 < 0x10))
                            )))))) ||
             (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) < 0x10)))) {
      if ((in_RSI[0x1d] & 1) == 0) {
        lVar3 = *(long *)((long)in_RDI->data + -0x18);
        puVar7 = (undefined8 *)((long)&in_RDI[4].cstep + lVar3);
        in_stack_ffffffffffffff38 = &in_RDI->elempack;
        if (in_stack_ffffffffffffff38 != (int *)puVar7) {
          if (*(long *)((long)&in_RDI[5].data + lVar3) != 0) {
            piVar8 = *(int **)((long)&in_RDI[5].data + lVar3);
            LOCK();
            *piVar8 = *piVar8 + 1;
            UNLOCK();
          }
          piVar8 = in_stack_ffffffffffffff38;
          pMVar9 = in_RDI;
          if (in_RDI->allocator != (Allocator *)0x0) {
            pAVar2 = in_RDI->allocator;
            LOCK();
            iVar6 = *(int *)&pAVar2->_vptr_Allocator;
            *(int *)&pAVar2->_vptr_Allocator = *(int *)&pAVar2->_vptr_Allocator + -1;
            UNLOCK();
            if (iVar6 == 1) {
              if (*(long *)&in_RDI->c == 0) {
                if (*(void **)in_stack_ffffffffffffff38 != (void *)0x0) {
                  free(*(void **)in_stack_ffffffffffffff38);
                }
              }
              else {
                (**(code **)(**(long **)&in_RDI->c + 0x18))
                          (*(long **)&in_RDI->c,*(undefined8 *)in_stack_ffffffffffffff38);
              }
            }
          }
          *(undefined8 *)in_stack_ffffffffffffff38 = 0;
          *(undefined8 *)(in_stack_ffffffffffffff38 + 4) = 0;
          in_stack_ffffffffffffff38[6] = 0;
          in_stack_ffffffffffffff38[10] = 0;
          in_stack_ffffffffffffff38[0xb] = 0;
          in_stack_ffffffffffffff38[0xc] = 0;
          in_stack_ffffffffffffff38[0xd] = 0;
          in_stack_ffffffffffffff38[0xe] = 0;
          *(undefined8 *)(in_stack_ffffffffffffff38 + 0x10) = 0;
          *(Allocator **)(in_stack_ffffffffffffff38 + 2) = (Allocator *)0x0;
          *(undefined8 *)piVar8 = *puVar7;
          *(Allocator **)(piVar8 + 2) = *(Allocator **)((long)&in_RDI[5].data + lVar3);
          *(undefined8 *)(piVar8 + 4) = *(undefined8 *)((long)&in_RDI[5].refcount + lVar3);
          piVar8[6] = *(int *)((long)&in_RDI[5].elemsize + lVar3);
          *(undefined8 *)(piVar8 + 8) = *(undefined8 *)((long)&in_RDI[5].elempack + lVar3);
          piVar8[10] = *(undefined4 *)((long)&in_RDI[5].allocator + lVar3);
          piVar8[0xb] = *(undefined4 *)((long)&in_RDI[5].allocator + lVar3 + 4);
          piVar8[0xc] = *(undefined4 *)((long)&in_RDI[5].dims + lVar3);
          piVar8[0xd] = *(undefined4 *)((long)&in_RDI[5].w + lVar3);
          piVar8[0xe] = *(undefined4 *)((long)&in_RDI[5].h + lVar3);
          *(undefined8 *)(piVar8 + 0x10) = *(undefined8 *)((long)&in_RDI[5].c + lVar3);
          in_stack_ffffffffffffff30 = in_stack_ffffffffffffff38;
          in_stack_ffffffffffffff38 = piVar8;
          in_RDI = pMVar9;
        }
      }
      else {
        convolution_im2col_sgemm_transform_kernel_int8_sse
                  ((Mat *)CONCAT44(in_stack_000002a4,in_stack_000002a0),in_stack_00000298,
                   in_stack_00000294,in_stack_00000290,in_stack_0000028c,in_stack_00000288);
      }
      _w = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    }
    else {
      conv3x3s1_winograd23_transform_kernel_int8_sse
                (in_stack_00000018,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                 unaff_retaddr);
    }
  }
  Mat::create(in_RDI,_w,(size_t)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  for (local_b4 = 0;
      local_b4 < *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18));
      local_b4 = local_b4 + 1) {
    fVar1 = *(float *)(*(long *)((long)&in_RDI[6].cstep + *(long *)((long)in_RDI->data + -0x18)) +
                      (long)local_b4 * 4);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      local_b8 = 1.0 / (**(float **)((long)&in_RDI[7].cstep + *(long *)((long)in_RDI->data + -0x18))
                       * *(float *)(*(long *)((long)&in_RDI[6].cstep +
                                             *(long *)((long)in_RDI->data + -0x18)) +
                                   (long)local_b4 * 4));
    }
    else {
      local_b8 = 0.0;
    }
    *(float *)(*(long *)&in_RDI[5].dims + (long)local_b4 * 4) = local_b8;
  }
  if ((*in_RSI & 1) != 0) {
    lVar3 = *(long *)((long)in_RDI->data + -0x18);
    puVar7 = (undefined8 *)((long)&in_RDI[4].cstep + lVar3);
    if (*(long *)((long)&in_RDI[5].data + lVar3) != 0) {
      piVar8 = *(int **)((long)&in_RDI[5].data + lVar3);
      LOCK();
      iVar6 = *piVar8;
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (iVar6 == 1) {
        if (*(long *)((long)&in_RDI[5].elempack + lVar3) == 0) {
          if ((void *)*puVar7 != (void *)0x0) {
            free((void *)*puVar7);
          }
        }
        else {
          plVar4 = *(long **)((long)&in_RDI[5].elempack + lVar3);
          (**(code **)(*plVar4 + 0x18))(plVar4,*puVar7);
        }
      }
    }
    *puVar7 = 0;
    puVar7[2] = 0;
    *(undefined4 *)(puVar7 + 3) = 0;
    *(undefined4 *)(puVar7 + 5) = 0;
    *(undefined4 *)((long)puVar7 + 0x2c) = 0;
    *(undefined4 *)(puVar7 + 6) = 0;
    *(undefined4 *)((long)puVar7 + 0x34) = 0;
    *(undefined4 *)(puVar7 + 7) = 0;
    puVar7[8] = 0;
    puVar7[1] = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            // conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}